

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  TString *pTVar2;
  uint uVar3;
  stringtable *psVar4;
  TString **ppTVar5;
  uint h;
  TString *hnext;
  TString *p;
  stringtable *tb;
  int i;
  int newsize_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  psVar4 = &pgVar1->strt;
  if ((pgVar1->strt).size < newsize) {
    ppTVar5 = (TString **)
              luaM_realloc_(L,psVar4->hash,(long)(pgVar1->strt).size << 3,(long)newsize << 3);
    psVar4->hash = ppTVar5;
    for (tb._0_4_ = (pgVar1->strt).size; (int)tb < newsize; tb._0_4_ = (int)tb + 1) {
      psVar4->hash[(int)tb] = (TString *)0x0;
    }
  }
  for (tb._0_4_ = 0; (int)tb < (pgVar1->strt).size; tb._0_4_ = (int)tb + 1) {
    hnext = psVar4->hash[(int)tb];
    psVar4->hash[(int)tb] = (TString *)0x0;
    while (hnext != (TString *)0x0) {
      pTVar2 = (hnext->u).hnext;
      uVar3 = hnext->hash & newsize - 1U;
      hnext->u = *(anon_union_8_2_b887aad4_for_u *)(psVar4->hash + uVar3);
      psVar4->hash[uVar3] = hnext;
      hnext = pTVar2;
    }
  }
  if (newsize < (pgVar1->strt).size) {
    ppTVar5 = (TString **)
              luaM_realloc_(L,psVar4->hash,(long)(pgVar1->strt).size << 3,(long)newsize << 3);
    psVar4->hash = ppTVar5;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize(lua_State *L, int newsize) {
    int i;
    stringtable *tb = &G(L)->strt;
    if (newsize > tb->size) {  /* grow table if needed */
        luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
        for (i = tb->size; i < newsize; i++)
            tb->hash[i] = NULL;
    }
    for (i = 0; i < tb->size; i++) {  /* rehash */
        TString *p = tb->hash[i];
        tb->hash[i] = NULL;
        while (p) {  /* for each node in the list */
            TString *hnext = p->u.hnext;  /* save next */
            unsigned int h = lmod(p->hash, newsize);  /* new position */
            p->u.hnext = tb->hash[h];  /* chain it */
            tb->hash[h] = p;
            p = hnext;
        }
    }
    if (newsize < tb->size) {  /* shrink table if needed */
        /* vanishing slice should be empty */
        lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
        luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
    }
    tb->size = newsize;
}